

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::
UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
::streamReconstructedExpression
          (UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
           *this,ostream *os)

{
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>
  *in_RDX;
  type local_30;
  
  StringMaker<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>,void>
  ::
  convert<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>>
            (&local_30,
             (StringMaker<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>,void>
              *)this->m_lhs,in_RDX);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }